

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineArc.cpp
# Opt level: O3

void __thiscall chrono::geometry::ChLineArc::ArchiveIN(ChLineArc *this,ChArchiveIn *marchive)

{
  ChFunctorArchiveInSpecific<chrono::ChCoordsys<double>_> specFuncA;
  char *local_48;
  double *local_40;
  undefined1 local_38;
  undefined **local_30;
  ChCoordsys<double> *local_28;
  
  ChArchiveIn::VersionRead<chrono::geometry::ChLineArc>(marchive);
  ChLine::ArchiveIN(&this->super_ChLine,marchive);
  local_40 = (double *)&local_30;
  local_28 = &this->origin;
  local_30 = &PTR__ChFunctorArchiveIn_00b039a0;
  local_48 = "origin";
  local_38 = 0;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_48);
  local_40 = &this->radius;
  local_48 = "radius";
  local_38 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_48);
  local_40 = &this->angle1;
  local_48 = "angle1";
  local_38 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_48);
  local_40 = &this->angle2;
  local_48 = "angle2";
  local_38 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_48);
  local_40 = (double *)&this->counterclockwise;
  local_48 = "counterclockwise";
  local_38 = 0;
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_48);
  return;
}

Assistant:

void ChLineArc::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLineArc>();
    // deserialize parent class
    ChLine::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(origin);
    marchive >> CHNVP(radius);
    marchive >> CHNVP(angle1);
    marchive >> CHNVP(angle2);
    marchive >> CHNVP(counterclockwise);
}